

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Init(MD5_CTX *c)

{
  md5_ctx *context_local;
  
  c->Nh = 0;
  c->Nl = 0;
  c->A = 0x67452301;
  c->B = 0xefcdab89;
  c->C = 0x98badcfe;
  c->D = 0x10325476;
  return (int)c;
}

Assistant:

static void MD5_Init(struct md5_ctx *context)
{
  context->count[0] = context->count[1] = 0;
  /* Load magic initialization constants. */
  context->state[0] = 0x67452301;
  context->state[1] = 0xefcdab89;
  context->state[2] = 0x98badcfe;
  context->state[3] = 0x10325476;
}